

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_death_test.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::PrinterDeathTest_FormatInternalZeroArg_Test::TestBody
          (PrinterDeathTest_FormatInternalZeroArg_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  bool bVar1;
  int iVar2;
  uint uVar3;
  ZeroCopyOutputStream *output;
  char *message;
  char *regex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c0;
  AssertHelper local_268;
  Message local_260;
  int local_254;
  exception *gtest_exception;
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_218;
  undefined1 local_1f3;
  allocator<char> local_1f2;
  allocator<char> local_1f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8 [32];
  iterator local_1a8;
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_198;
  ReturnSentinel local_188;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_160;
  DeathTest *gtest_dt;
  undefined1 local_148 [8];
  Printer printer;
  FakeAnnotationCollector collector;
  PrinterDeathTest_FormatInternalZeroArg_Test *this_local;
  
  FakeAnnotationCollector::FakeAnnotationCollector((FakeAnnotationCollector *)&printer.field_0x128);
  output = PrinterDeathTest::output(&this->super_PrinterDeathTest);
  Printer::Printer((Printer *)local_148,output,'$',(AnnotationCollector *)&printer.field_0x128);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr,(internal *)(anon_var_dwarf_37cdd0 + 5),regex);
    bVar1 = testing::internal::DeathTest::Create
                      ("printer.FormatInternal({\"arg1\", \"arg2\"}, {}, \"$0$\")",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer_death_test.cc"
                       ,0x83,&local_160);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (local_160 == (pointer)0x0) goto LAB_0108e1fe;
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel,local_160);
      iVar2 = (*local_160->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_160->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_160->_vptr_DeathTest[4])(local_160,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_0108e10f;
        local_254 = 2;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_188,local_160);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            local_1f3 = 1;
            local_1f0 = &local_1e8;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1e8,"arg1",&local_1f1);
            local_1f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_1c8;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(local_1c8,"arg2",&local_1f2);
            local_1f3 = 0;
            local_1a8 = &local_1e8;
            local_1a0 = 2;
            v._M_len = 2;
            v._M_array = local_1a8;
            absl::lts_20250127::Span<std::__cxx11::string_const>::
            Span<std::__cxx11::string_const,std::__cxx11::string_const>
                      ((Span<std::__cxx11::string_const> *)local_198._M_local_buf,v);
            absl::lts_20250127::
            flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::flat_hash_map(&local_218);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_exception,"$0$");
            Printer::
            FormatInternal<absl::lts_20250127::flat_hash_map<std::__cxx11::string,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
                      ((Printer *)local_148,
                       (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )local_198,&local_218,_gtest_exception);
            absl::lts_20250127::
            flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~flat_hash_map(&local_218);
            local_2c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_1a8;
            do {
              local_2c0 = local_2c0 + -1;
              std::__cxx11::string::~string((string *)local_2c0);
            } while (local_2c0 != &local_1e8);
            std::allocator<char>::~allocator(&local_1f2);
            std::allocator<char>::~allocator(&local_1f1);
          }
          (*local_160->_vptr_DeathTest[5])(local_160,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_188);
        }
LAB_0108e10f:
        local_254 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel);
      if (local_254 == 0) goto LAB_0108e1fe;
    }
  }
  testing::Message::Message(&local_260);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_268,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer_death_test.cc"
             ,0x83,message);
  testing::internal::AssertHelper::operator=(&local_268,&local_260);
  testing::internal::AssertHelper::~AssertHelper(&local_268);
  testing::Message::~Message(&local_260);
LAB_0108e1fe:
  Printer::~Printer((Printer *)local_148);
  FakeAnnotationCollector::~FakeAnnotationCollector((FakeAnnotationCollector *)&printer.field_0x128)
  ;
  return;
}

Assistant:

TEST_F(PrinterDeathTest, FormatInternalZeroArg) {
  FakeAnnotationCollector collector;
  Printer printer(output(), '$', &collector);

  EXPECT_DEATH(printer.FormatInternal({"arg1", "arg2"}, {}, "$0$"), "");
}